

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O3

uc_err reg_read_mips(void *_env,int mode,uint regid,void *value,size_t *size)

{
  uc_err uVar1;
  CPUMIPSState *env;
  undefined4 *puVar2;
  
  if (regid - 2 < 0x20) {
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    puVar2 = (undefined4 *)((long)_env + (ulong)(regid - 2) * 4);
  }
  else {
    uVar1 = UC_ERR_ARG;
    switch(regid) {
    case 0x81:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      puVar2 = (undefined4 *)((long)_env + 0x84);
      break;
    case 0x82:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      puVar2 = (undefined4 *)((long)_env + 0x94);
      break;
    case 0x83:
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x87:
    case 0x88:
      goto switchD_004a87b0_caseD_83;
    case 0x89:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      puVar2 = (undefined4 *)((long)_env + 0x570);
      break;
    case 0x8a:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      puVar2 = (undefined4 *)((long)_env + 0xd4);
      break;
    case 0x8b:
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      puVar2 = (undefined4 *)((long)_env + 0x53c);
      break;
    default:
      if (regid != 1) {
        return UC_ERR_ARG;
      }
      if (*size < 4) {
        return UC_ERR_OVERFLOW;
      }
      *size = 4;
      puVar2 = (undefined4 *)((long)_env + 0x80);
    }
  }
  *(undefined4 *)value = *puVar2;
  uVar1 = UC_ERR_OK;
switchD_004a87b0_caseD_83:
  return uVar1;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_read(void *_env, int mode, unsigned int regid, void *value,
                size_t *size)
{
    CPUMIPSState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_MIPS_REG_0 && regid <= UC_MIPS_REG_31) {
        CHECK_REG_TYPE(mipsreg_t);
        *(mipsreg_t *)value = env->active_tc.gpr[regid - UC_MIPS_REG_0];
    } else {
        switch (regid) {
        default:
            break;
        case UC_MIPS_REG_HI:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->active_tc.HI[0];
            break;
        case UC_MIPS_REG_LO:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->active_tc.LO[0];
            break;
        case UC_MIPS_REG_PC:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->active_tc.PC;
            break;
        case UC_MIPS_REG_CP0_CONFIG3:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->CP0_Config3;
            break;
        case UC_MIPS_REG_CP0_STATUS:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->CP0_Status;
            break;
        case UC_MIPS_REG_CP0_USERLOCAL:
            CHECK_REG_TYPE(mipsreg_t);
            *(mipsreg_t *)value = env->active_tc.CP0_UserLocal;
            break;
        }
    }

    return ret;
}